

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

int __thiscall r_code::list<r_code::Code_*>::remove(list<r_code::Code_*> *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  Code **ppCVar2;
  const_iterator cVar3;
  undefined1 local_28 [8];
  const_iterator i;
  Code **t_local;
  list<r_code::Code_*> *this_local;
  
  i._list = (list<r_code::Code_*> *)__filename;
  const_iterator::const_iterator((const_iterator *)local_28,this,this->used_cells_head);
  while( true ) {
    bVar1 = _iterator::operator!=
                      ((_iterator *)local_28,(_iterator *)list<r_code::Code*>::end_iterator);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    ppCVar2 = const_iterator::operator*((const_iterator *)local_28);
    if (*ppCVar2 ==
        (Code *)((i._list)->cells).
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start) break;
    const_iterator::operator++((const_iterator *)local_28);
  }
  cVar3 = erase(this,(const_iterator *)local_28);
  return (int)cVar3.super__iterator._cell;
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }